

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O3

int File::copy(string *from,string *to)

{
  uint uVar1;
  ulong uVar2;
  ofstream dst;
  ifstream src;
  long local_420;
  filebuf local_418 [240];
  ios_base local_328 [264];
  undefined1 local_220 [16];
  streambuf local_210 [504];
  
  uVar1 = access((from->_M_dataplus)._M_p,0);
  uVar2 = (ulong)uVar1;
  if (uVar1 == 0) {
    std::ifstream::ifstream(local_220,(string *)from,_S_bin);
    std::ofstream::ofstream(&local_420,(string *)to,_S_bin);
    std::ostream::operator<<((ostream *)&local_420,local_210);
    local_420 = _VTT;
    *(undefined8 *)(local_418 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf(local_418);
    std::ios_base::~ios_base(local_328);
    uVar2 = std::ifstream::~ifstream(local_220);
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),uVar1 == 0);
}

Assistant:

bool File::copy (const std::string& from, const std::string& to)
{
  // 'from' must exist.
  if (! access (from.c_str (), F_OK))
  {
    std::ifstream src (from, std::ios::binary);
    std::ofstream dst (to,   std::ios::binary);

    dst << src.rdbuf ();
    return true;
  }

  return false;
}